

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_tree.c
# Opt level: O2

void trb_print_parents(lysc_node *node,trt_wrapper *wr_in,trt_printer_ctx *pc,trt_tree_ctx *tc)

{
  trt_wrapper wr;
  uint32_t max_gap_before_type;
  lysc_node *node_00;
  trt_wrapper local_a8;
  trt_node local_90;
  
  if (((wr_in != (trt_wrapper *)0x0) && (pc != (trt_printer_ctx *)0x0)) &&
     (*(int *)((long)&pc->out + 4) == 0)) {
    if (node != (lysc_node *)0x0) {
      trb_print_parents(node->parent,wr_in,pc,tc);
      (pc->fp).read.module_name = (_func_trt_keyword_stmt_trt_tree_ctx_ptr *)node;
      trb_count_depth(&local_a8,(trt_wrapper *)node,node_00);
      ly_print_(*(ly_out **)wr_in,"\n");
      (**(code **)(wr_in + 2))(&local_90,0x1000400000000,0,pc);
      local_90.last_one = '\x01';
      max_gap_before_type =
           trb_max_gap_to_type((trt_parent_cache)ZEXT816(0x1000400000000),(trt_printer_ctx *)wr_in,
                               (trt_tree_ctx *)pc);
      (pc->fp).read.module_name = (_func_trt_keyword_stmt_trt_tree_ctx_ptr *)node;
      wr.bit_marks1 = local_a8.bit_marks1;
      wr.type = local_a8.type;
      wr._4_4_ = local_a8._4_4_;
      wr.actual_pos = local_a8.actual_pos;
      wr._20_4_ = local_a8._20_4_;
      trb_print_entire_node
                (&local_90,max_gap_before_type,wr,(trt_printer_ctx *)wr_in,(trt_tree_ctx *)pc);
    }
    return;
  }
  __assert_fail("pc && tc && tc->section == TRD_SECT_MODULE",
                "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/printer_tree.c"
                ,0xe9e,
                "void trb_print_parents(const struct lysc_node *, struct trt_wrapper *, struct trt_printer_ctx *, struct trt_tree_ctx *)"
               );
}

Assistant:

static void
trb_print_parents(const struct lysc_node *node, struct trt_wrapper *wr_in, struct trt_printer_ctx *pc, struct trt_tree_ctx *tc)
{
    uint32_t max_gap_before_type;
    struct trt_wrapper wr;
    struct trt_node print_node;

    assert(pc && tc && tc->section == TRD_SECT_MODULE);

    /* stop recursion */
    if (!node) {
        return;
    }
    trb_print_parents(node->parent, wr_in, pc, tc);

    /* setup for printing */
    tc->cn = node;
    wr = trb_count_depth(wr_in, node);

    /* print node */
    ly_print_(pc->out, "\n");
    print_node = pc->fp.read.node(TRP_EMPTY_PARENT_CACHE, tc);
    /* siblings do not print, so the node is always considered the last */
    print_node.last_one = 1;
    max_gap_before_type = trb_max_gap_to_type(TRP_EMPTY_PARENT_CACHE, pc, tc);
    tc->cn = node;
    trb_print_entire_node(&print_node, max_gap_before_type, wr, pc, tc);
}